

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairing.c
# Opt level: O1

int compute_6tplus2_naf(int **naf,int *naf_len,fp_struct_st *t)

{
  size_t size;
  bool bVar1;
  uint uVar2;
  int iVar3;
  BIGNUM *a;
  int *__src;
  int *__dest;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  
  a = BN_new();
  if (a == (BIGNUM *)0x0) {
    __src = (int *)0x0;
    __dest = (int *)0x0;
  }
  else {
    BN_set_words((BIGNUM *)a,t->d,4);
    BN_mul_word(a,6);
    BN_add_word(a,2);
    uVar2 = BN_num_bits(a);
    if ((int)uVar2 < 1) {
      __src = (int *)0x0;
      __dest = (int *)0x0;
    }
    else {
      uVar5 = (ulong)uVar2;
      size = uVar5 * 4 + 4;
      __src = (int *)CRYPTO_zalloc(size);
      __dest = (int *)CRYPTO_zalloc(size);
      if (__dest != (int *)0x0 && __src != (int *)0x0) {
        uVar6 = uVar5;
        piVar10 = __src;
        do {
          iVar3 = BN_is_bit_set(a,(int)uVar6);
          *piVar10 = iVar3;
          piVar10 = piVar10 + 1;
          uVar6 = uVar6 - 1;
          uVar9 = uVar2;
        } while (uVar6 != 0);
        do {
          uVar8 = 1;
          if ((int)uVar9 < 1) {
            uVar8 = uVar9;
          }
          uVar7 = uVar9;
          do {
            uVar4 = uVar7;
            if (__src[uVar7] != 1) break;
            bVar1 = 1 < (int)uVar7;
            uVar4 = uVar8 - 1;
            uVar7 = uVar7 - 1;
          } while (bVar1);
          if (2 < (int)uVar9 && uVar4 == 0) {
            __src[uVar9] = -1;
            uVar8 = uVar9 - 1;
            uVar7 = uVar9 - 2;
            uVar9 = 0;
            memset(__src + ((ulong)uVar8 - (ulong)uVar7),0,(ulong)uVar8 * 4);
            *__src = 1;
          }
          if ((int)(uVar9 - uVar4) < 2) {
            uVar9 = uVar9 - 1;
          }
          else {
            __src[uVar9] = -1;
            uVar8 = uVar9 - 1;
            uVar9 = uVar8;
            for (; (int)uVar4 < (int)uVar8; uVar8 = uVar8 - 1) {
              __src[uVar8] = 0;
              uVar9 = uVar4;
            }
            __src[(int)uVar9] = 1;
          }
          if ((int)uVar9 < 1) {
            if (*__src == 1) {
              memcpy(__dest,__src,size);
              uVar2 = uVar2 + 1;
            }
            else {
              memcpy(__dest,__src + 1,uVar5 << 2);
            }
            *naf = __dest;
            *naf_len = uVar2;
            CRYPTO_free(__src);
            BN_free(a);
            return 1;
          }
        } while( true );
      }
    }
  }
  *naf = (int *)0x0;
  *naf_len = 0;
  CRYPTO_free(__src);
  CRYPTO_free(__dest);
  BN_free(a);
  return 0;
}

Assistant:

int compute_6tplus2_naf(int **naf, int *naf_len, fp_t t)
{
    int bits, i, j;
    int *tmp = NULL;
    int *ret = NULL;
    BIGNUM *z = NULL;

    z = BN_new();
    if (z == NULL)
        goto end;

    BN_set_words(z, t->d, N_LIMBS);
    BN_mul_word(z, 6);
    BN_add_word(z, 2);
    bits = BN_num_bits(z);
    if (bits <= 0)
        goto end;

    tmp = (int*)CRYPTO_zalloc((bits + 1) * sizeof(int));
    ret = (int*)CRYPTO_zalloc((bits + 1) * sizeof(int));
    if (tmp == NULL || ret == NULL)
        goto end;

    for (i = 0; i < bits; i++)
        tmp[i] = BN_is_bit_set(z, bits - i);

    i = bits;
    while (i > 0) {
        j = i;
        while (j > 0 && tmp[j] == 1)
            j--;

        if (j == 0) {
            if ((i - j) >= 3) {
                tmp[i] = -1;
                i--;
                while (i > j) {
                    tmp[i] = 0;
                    i--;
                }
                tmp[i] = 1;
            }
        }

        /* ***11*** --> **10-1*** */
        if ((i - j) >= 2) {
            tmp[i] = -1;
            i--;
            while (i > j) {
                tmp[i] = 0;
                i--;
            }
            tmp[i] = 1;
        }
        else
            i--;
    }

    if (tmp[0] == 1) {
        memcpy(ret, tmp, (bits + 1) * sizeof(int));
        *naf = ret;
        *naf_len = (bits + 1);
    }
    else {
        memcpy(ret, tmp + 1, bits * sizeof(int));
        *naf = ret;
        *naf_len = bits;
    }

    CRYPTO_free(tmp);
    BN_free(z);
    return GML_OK;
end:
    *naf = NULL;
    *naf_len = 0;
    CRYPTO_free(tmp);
    CRYPTO_free(ret);
    BN_free(z);
    return GML_ERROR;
}